

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.cpp
# Opt level: O3

int musl_getopt_long_only(int argc,char **argv,char *optstring,option *longopts,int *idx)

{
  option *poVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *name;
  char *pcVar7;
  char **ppcVar8;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  long lVar20;
  char cVar21;
  long lVar22;
  wchar_t wVar23;
  bool bVar24;
  wchar_t c;
  char *local_60;
  ulong local_58;
  wchar_t local_50;
  wchar_t local_4c;
  ulong local_48;
  char *local_40;
  int *local_38;
  
  if ((musl_optind == 0) || (musl_optreset != 0)) {
    musl_optreset = 0;
    musl_optpos = 0;
    musl_optind = 1;
  }
  iVar4 = musl_optind;
  if (argc <= musl_optind) {
    return -1;
  }
  lVar22 = (long)musl_optind;
  if (argv[lVar22] == (char *)0x0) {
    return -1;
  }
  iVar15 = musl_optind;
  if ((*optstring != '+') && (*optstring != '-')) {
    ppcVar8 = argv + lVar22;
    while( true ) {
      pcVar11 = *ppcVar8;
      if (pcVar11 == (char *)0x0) {
        return -1;
      }
      if ((*pcVar11 == '-') && (pcVar11[1] != '\0')) break;
      iVar15 = iVar15 + 1;
      ppcVar8 = ppcVar8 + 1;
      if (argc == iVar15) {
        return -1;
      }
    }
  }
  musl_optind = iVar15;
  iVar15 = musl_optind;
  musl_optarg = (char *)0x0;
  if ((((longopts == (option *)0x0) || (pcVar11 = argv[musl_optind], *pcVar11 != '-')) ||
      (bVar14 = pcVar11[1], bVar14 == 0)) || ((bVar14 == 0x2d && (pcVar11[2] == '\0')))) {
    bVar24 = false;
LAB_00113d0e:
    if ((musl_optind == 0) || (bVar24)) {
      musl_optreset = 0;
      musl_optpos = 0;
      musl_optind = 1;
    }
    wVar23 = L'\xffffffff';
    if ((argc <= musl_optind) || (pcVar11 = argv[musl_optind], pcVar11 == (char *)0x0))
    goto LAB_001141ac;
    if (*pcVar11 != '-') {
      if (*optstring == '-') {
        musl_optind = musl_optind + 1;
        wVar23 = L'\x01';
        musl_optarg = pcVar11;
      }
      goto LAB_001141ac;
    }
    if (pcVar11[1] == '\0') goto LAB_001141ac;
    if ((pcVar11[1] == '-') && (pcVar11[2] == '\0')) {
      musl_optind = musl_optind + 1;
      goto LAB_001141ac;
    }
    if (musl_optpos == 0) {
      musl_optpos = 1;
    }
    uVar5 = mbtowc(&local_4c,pcVar11 + (uint)musl_optpos,0x10);
    if ((int)uVar5 < 0) {
      local_4c = L'�';
      uVar5 = 1;
    }
    lVar20 = (long)musl_optind;
    uVar16 = (ulong)(uint)musl_optpos;
    sVar9 = (size_t)uVar5;
    lVar13 = sVar9 + uVar16;
    musl_optpos = (int)lVar13;
    if (argv[lVar20][lVar13] == '\0') {
      musl_optind = musl_optind + 1;
      musl_optpos = 0;
    }
    if ((*optstring == '-') || (*optstring == '+')) {
      optstring = optstring + 1;
    }
    pcVar7 = argv[lVar20] + uVar16;
    local_50 = L'\0';
    uVar16 = 0;
    do {
      uVar5 = mbtowc(&local_50,optstring + (uVar16 & 0xffffffff),0x10);
      uVar10 = 1;
      if (1 < (int)uVar5) {
        uVar10 = (ulong)uVar5;
      }
      uVar16 = uVar10 + (uVar16 & 0xffffffff);
    } while ((uVar5 != 0) && (local_50 != local_4c));
    if (local_50 == local_4c && local_4c != L':') {
      wVar23 = local_50;
      if (optstring[uVar16] != ':') goto LAB_001141ac;
      musl_optarg = (char *)0x0;
      if (musl_optpos != 0 || optstring[uVar16 + 1] != ':') {
        lVar13 = (long)musl_optind;
        musl_optind = musl_optind + 1;
        musl_optarg = argv[lVar13] + (uint)musl_optpos;
        musl_optpos = 0;
      }
      if (musl_optind <= argc) goto LAB_001141ac;
      musl_optopt = local_50;
      wVar23 = L':';
      if ((*optstring == ':') || (wVar23 = L'?', musl_opterr == 0)) goto LAB_001141ac;
      pcVar11 = *argv;
      pcVar18 = ": option requires an argument: ";
      musl_optopt = local_50;
    }
    else {
      musl_optopt = local_4c;
      wVar23 = L'?';
      if ((*optstring == ':') || (musl_opterr == 0)) goto LAB_001141ac;
      pcVar11 = *argv;
      pcVar18 = ": unrecognized option: ";
    }
  }
  else {
    cVar2 = optstring[(*optstring - 0x2bU & 0xfd) == 0];
    pcVar7 = longopts->name;
    if (pcVar7 == (char *)0x0) {
      iVar6 = 0;
LAB_00113f0f:
      if (bVar14 == 0x2d) {
        musl_optopt = 0;
        if ((cVar2 != ':') && (musl_opterr != 0)) {
          pcVar7 = *argv;
          pcVar18 = ": option is ambiguous: ";
          if (iVar6 == 0) {
            pcVar18 = ": unrecognized option: ";
          }
          sVar9 = strlen(pcVar11 + 2);
          musl_getopt_msg(pcVar7,pcVar18,pcVar11 + 2,sVar9);
        }
        musl_optind = musl_optind + 1;
        wVar23 = L'?';
        goto LAB_001141ac;
      }
      bVar24 = musl_optreset != 0;
      goto LAB_00113d0e;
    }
    pcVar18 = pcVar11 + 1;
    local_48 = CONCAT44(local_48._4_4_,(uint)bVar14);
    pcVar12 = pcVar11 + 2;
    if (bVar14 != 0x2d) {
      pcVar12 = pcVar18;
    }
    uVar16 = 0;
    local_60 = (char *)0x0;
    local_58 = 0;
    iVar6 = 0;
    pcVar19 = pcVar12;
LAB_00113c95:
    do {
      cVar3 = *pcVar19;
      local_38 = idx;
      if ((cVar3 == '\0') || (cVar3 == '=')) {
        cVar21 = *pcVar7;
LAB_00113cb7:
        local_60 = pcVar19;
        if (cVar21 == '\0') {
          local_58._0_4_ = (int)uVar16;
          goto LAB_00113f59;
        }
        iVar6 = iVar6 + 1;
        local_58 = uVar16 & 0xffffffff;
      }
      else {
        cVar21 = *pcVar7;
        if (cVar3 == cVar21) {
          pcVar7 = pcVar7 + 1;
          pcVar19 = pcVar19 + 1;
          goto LAB_00113c95;
        }
        if (cVar3 == '\0') goto LAB_00113cb7;
      }
      uVar16 = uVar16 + 1;
      pcVar7 = longopts[uVar16].name;
      pcVar19 = pcVar12;
    } while (pcVar7 != (char *)0x0);
    local_40 = pcVar11;
    if (iVar6 != 1) goto LAB_00113f0f;
LAB_00113f59:
    local_48 = (long)local_60 - (long)pcVar18;
    local_40 = optstring;
    iVar6 = mblen(pcVar18,0x10);
    if ((local_48 == (long)iVar6) && (*local_40 != '\0')) {
      uVar16 = 1;
      if (1 < (int)local_48) {
        uVar16 = local_48 & 0xffffffff;
      }
      lVar13 = 0;
      pcVar11 = local_40;
      do {
        uVar10 = 0;
        if (0 < (long)local_48) {
          uVar17 = 0;
          do {
            uVar10 = uVar17;
            if (pcVar18[uVar17] != pcVar11[uVar17]) break;
            uVar17 = uVar17 + 1;
            uVar10 = uVar16;
          } while (uVar16 != uVar17);
        }
        if ((int)uVar10 == (int)local_48) {
          pcVar11 = argv[musl_optind];
          bVar14 = pcVar11[1];
          iVar6 = 1;
          optstring = local_40;
          goto LAB_00113f0f;
        }
        pcVar11 = pcVar11 + 1;
        lVar20 = lVar13 + 1;
        lVar13 = lVar13 + 1;
      } while (local_40[lVar20] != '\0');
    }
    iVar6 = musl_optind + 1;
    poVar1 = longopts + (int)local_58;
    if (*local_60 != '=') {
      if (longopts[(int)local_58].has_arg == 1) {
        musl_optarg = argv[(long)musl_optind + 1];
        if (musl_optarg == (char *)0x0) {
          musl_optopt = poVar1->val;
          wVar23 = L':';
          musl_optind = iVar6;
          if ((cVar2 == ':') || (wVar23 = L'?', musl_opterr == 0)) goto LAB_001141ac;
          pcVar11 = *argv;
          pcVar7 = poVar1->name;
          sVar9 = strlen(pcVar7);
          pcVar18 = ": option requires an argument: ";
          goto LAB_0011417c;
        }
        iVar6 = musl_optind + 2;
      }
LAB_001140ee:
      musl_optind = iVar6;
      if (local_38 != (int *)0x0) {
        *local_38 = (int)local_58;
      }
      wVar23 = poVar1->val;
      if (poVar1->flag != (wchar_t *)0x0) {
        *poVar1->flag = poVar1->val;
        wVar23 = L'\0';
      }
      goto LAB_001141ac;
    }
    if (longopts[(int)local_58].has_arg != 0) {
      musl_optarg = local_60 + 1;
      goto LAB_001140ee;
    }
    musl_optopt = poVar1->val;
    wVar23 = L'?';
    musl_optind = iVar6;
    if ((cVar2 == ':') || (musl_opterr == 0)) goto LAB_001141ac;
    pcVar11 = *argv;
    pcVar7 = poVar1->name;
    sVar9 = strlen(pcVar7);
    pcVar18 = ": option does not take an argument: ";
  }
LAB_0011417c:
  musl_getopt_msg(pcVar11,pcVar18,pcVar7,sVar9);
  wVar23 = L'?';
LAB_001141ac:
  if (iVar4 < iVar15) {
    iVar6 = musl_optind - iVar15;
    if (iVar6 != 0 && iVar15 <= musl_optind) {
      lVar13 = (long)musl_optind + -1;
      iVar15 = 0;
      do {
        pcVar11 = argv[(long)musl_optind + -1];
        lVar20 = lVar13;
        if (iVar4 < (int)lVar13) {
          do {
            argv[lVar20] = argv[lVar20 + -1];
            lVar20 = lVar20 + -1;
          } while (lVar22 < lVar20);
        }
        argv[lVar22] = pcVar11;
        iVar15 = iVar15 + 1;
      } while (iVar15 != iVar6);
    }
    musl_optind = iVar6 + iVar4;
  }
  return wVar23;
}

Assistant:

int musl_getopt_long_only(int argc, char **argv, char const *optstring,
			  const struct option *longopts, int *idx)
{
	return musl_getopt_long(argc, argv, optstring, longopts, idx, 1);
}